

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

void bignSeedInc(octet *seed)

{
  byte bVar1;
  size_t pos;
  word carry;
  octet *seed_local;
  
  carry = 1;
  for (pos = 0; pos < 8; pos = pos + 1) {
    bVar1 = seed[pos];
    seed[pos] = (octet)(bVar1 + carry);
    carry = bVar1 + carry >> 8;
  }
  return;
}

Assistant:

static void bignSeedInc(octet seed[8])
{
	register word carry;
	size_t pos;
	ASSERT(memIsValid(seed, 8));
	for (carry = 1, pos = 0; pos < 8; ++pos)
		carry += seed[pos], seed[pos] = (octet)carry, carry >>= 8;
	carry = 0;
}